

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundBetweenExpression::Deserialize(BoundBetweenExpression *this,Deserializer *deserializer)

{
  BoundBetweenExpression *this_00;
  pointer pBVar1;
  _Head_base<0UL,_duckdb::BoundBetweenExpression_*,_false> local_20;
  
  this_00 = (BoundBetweenExpression *)operator_new(0x78);
  BoundBetweenExpression(this_00);
  local_20._M_head_impl = this_00;
  pBVar1 = unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (deserializer,200,"input",&pBVar1->input);
  pBVar1 = unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (deserializer,0xc9,"lower",&pBVar1->lower);
  pBVar1 = unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (deserializer,0xca,"upper",&pBVar1->upper);
  pBVar1 = unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0xcb,"lower_inclusive",&pBVar1->lower_inclusive);
  pBVar1 = unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0xcc,"upper_inclusive",&pBVar1->upper_inclusive);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundBetweenExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<BoundBetweenExpression>(new BoundBetweenExpression());
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(200, "input", result->input);
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(201, "lower", result->lower);
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(202, "upper", result->upper);
	deserializer.ReadPropertyWithDefault<bool>(203, "lower_inclusive", result->lower_inclusive);
	deserializer.ReadPropertyWithDefault<bool>(204, "upper_inclusive", result->upper_inclusive);
	return std::move(result);
}